

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition.c
# Opt level: O0

int coda_product_variable_get_size(coda_product *product,char *name,long *size)

{
  int iVar1;
  long lVar2;
  long index;
  long *size_local;
  char *name_local;
  coda_product *product_local;
  
  if (((product != (coda_product *)0x0) && (name != (char *)0x0)) && (size != (long *)0x0)) {
    if (product->product_variable != (int64_t **)0x0) {
      lVar2 = coda_hashtable_get_index_from_name(product->product_definition->hash_data,name);
      if (lVar2 == -1) {
        coda_set_error(-400,
                       "product type %s (version %d) does not contain a product variable with name %s"
                       ,product->product_definition->product_type->name,
                       (ulong)(uint)product->product_definition->version,name);
        product_local._4_4_ = -1;
      }
      else if ((product->product_variable[lVar2] == (int64_t *)0x0) &&
              (iVar1 = init_product_variable(product,(int)lVar2), iVar1 != 0)) {
        product_local._4_4_ = -1;
      }
      else {
        *size = product->product_variable_size[lVar2];
        product_local._4_4_ = 0;
      }
      return product_local._4_4_;
    }
    __assert_fail("product->product_variable != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-definition.c"
                  ,0xb5,"int coda_product_variable_get_size(coda_product *, const char *, long *)");
  }
  __assert_fail("product != NULL && name != NULL && size != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-definition.c"
                ,0xb4,"int coda_product_variable_get_size(coda_product *, const char *, long *)");
}

Assistant:

int coda_product_variable_get_size(coda_product *product, const char *name, long *size)
{
    long index;

    assert(product != NULL && name != NULL && size != NULL);
    assert(product->product_variable != NULL);

    index = hashtable_get_index_from_name(product->product_definition->hash_data, name);
    if (index == -1)
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION,
                       "product type %s (version %d) does not contain a product variable with name %s",
                       product->product_definition->product_type->name, product->product_definition->version, name);
        return -1;
    }

    if (product->product_variable[index] == NULL)
    {
        if (init_product_variable(product, index) != 0)
        {
            return -1;
        }
    }
    *size = product->product_variable_size[index];

    return 0;
}